

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

void __thiscall libcellml::Variable::removeAllEquivalences(Variable *this)

{
  int iVar1;
  EntityImpl *pEVar2;
  long *plVar3;
  int iVar4;
  long *plVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar6;
  shared_ptr<libcellml::Variable> thisVariable;
  VariablePtr VStack_38;
  
  std::__shared_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Variable,void>
            ((__shared_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2> *)&VStack_38,
             (__weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libcellml::Variable>);
  pEVar2 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  plVar5 = *(long **)((long)&pEVar2[2].mId.field_2 + 8);
  plVar3 = (long *)pEVar2[3].mId._M_dataplus._M_p;
  do {
    if (plVar5 == plVar3) {
      pEVar2 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
      std::
      vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
      ::_M_erase_at_end((vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
                         *)((long)&pEVar2[2].mId.field_2 + 8),
                        *(pointer *)((long)&pEVar2[2].mId.field_2 + 8));
      if (VStack_38.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (VStack_38.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      return;
    }
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar4 = this_00->_M_use_count;
      do {
        if (iVar4 == 0) {
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar1 = this_00->_M_use_count;
        bVar6 = iVar4 == iVar1;
        if (bVar6) {
          this_00->_M_use_count = iVar4 + 1;
          iVar1 = iVar4;
        }
        iVar4 = iVar1;
        UNLOCK();
      } while (!bVar6);
    }
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = this_00->_M_use_count == 0;
    }
    if ((!bVar6) && (*plVar5 != 0)) {
      VariableImpl::unsetEquivalentTo(*(VariableImpl **)(*plVar5 + 8),&VStack_38);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    plVar5 = plVar5 + 2;
  } while( true );
}

Assistant:

void Variable::removeAllEquivalences()
{
    auto thisVariable = shared_from_this();
    for (const auto &variable : pFunc()->mEquivalentVariables) {
        auto equivalentVariable = variable.lock();
        if (equivalentVariable != nullptr) {
            equivalentVariable->pFunc()->unsetEquivalentTo(thisVariable);
        }
    }
    pFunc()->mEquivalentVariables.clear();
}